

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

void Llb_NonlinReorder(DdManager *dd,int fTwice,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  int fVerbose_local;
  int fTwice_local;
  DdManager *dd_local;
  
  aVar3 = Abc_Clock();
  if (fVerbose != 0) {
    uVar1 = Cudd_ReadKeys(dd);
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print(1,"Reordering... Before =%5d. ",(ulong)(uVar1 - uVar2));
  }
  Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
  if (fVerbose != 0) {
    uVar1 = Cudd_ReadKeys(dd);
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print(1,"After =%5d. ",(ulong)(uVar1 - uVar2));
  }
  if ((fTwice != 0) && (Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100), fVerbose != 0)) {
    uVar1 = Cudd_ReadKeys(dd);
    uVar2 = Cudd_ReadDead(dd);
    Abc_Print(1,"After =%5d. ",(ulong)(uVar1 - uVar2));
  }
  if (fVerbose != 0) {
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - aVar3);
  }
  return;
}

Assistant:

void Llb_NonlinReorder( DdManager * dd, int fTwice, int fVerbose )
{
    abctime clk = Abc_Clock();
    if ( fVerbose )
        Abc_Print( 1, "Reordering... Before =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
        Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    if ( fTwice )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
        if ( fVerbose )
            Abc_Print( 1, "After =%5d. ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}